

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::CompressionParameters> * __thiscall
kj::_::NullableValue<kj::CompressionParameters>::operator=
          (NullableValue<kj::CompressionParameters> *this,
          NullableValue<kj::CompressionParameters> *other)

{
  CompressionParameters *params;
  NullableValue<kj::CompressionParameters> *other_local;
  NullableValue<kj::CompressionParameters> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::CompressionParameters>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::CompressionParameters>(&(other->field_1).value);
      ctor<kj::CompressionParameters,kj::CompressionParameters>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }